

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O3

void array_list_free(array_list *arr)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = arr->length;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (arr->array[uVar2] != (void *)0x0) {
        (*arr->free_fn)(arr->array[uVar2]);
        uVar1 = arr->length;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  free(arr->array);
  free(arr);
  return;
}

Assistant:

extern void array_list_free(struct array_list *arr)
{
	size_t i;
	for (i = 0; i < arr->length; i++)
		if (arr->array[i])
			arr->free_fn(arr->array[i]);
	free(arr->array);
	free(arr);
}